

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

void __thiscall
Js::
CopyRemovePolicy<JsUtil::List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
::Remove(CopyRemovePolicy<JsUtil::List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
         *this,List<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *list,TElementType *item)

{
  int iVar1;
  Type ppBVar2;
  long lVar3;
  
  iVar1 = (list->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>)
          .count;
  if (0 < (long)iVar1) {
    ppBVar2 = (list->
              super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
              buffer;
    lVar3 = 0;
    do {
      if (ppBVar2[lVar3] == *item) {
        if ((int)lVar3 + 1 < iVar1) {
          do {
            ppBVar2[(int)lVar3] = ppBVar2[lVar3 + 1];
            lVar3 = lVar3 + 1;
          } while (iVar1 + -1 != (int)lVar3);
        }
        (list->super_ReadOnlyList<Js::BreakpointProbe_*,_Memory::ArenaAllocator,_DefaultComparer>).
        count = iVar1 + -1;
        ppBVar2[(long)iVar1 + -1] = (BreakpointProbe *)0x0;
        return;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != (int)lVar3);
  }
  return;
}

Assistant:

void Remove(TListType* list, const TElementType& item)
        {
            TElementType* buffer = list->buffer;
            int& count = list->count;

            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(buffer[i], item))
                {
                    for (int j = i + 1; j < count; i++, j++)
                    {
                        buffer[i] = buffer[j];
                    }
                    count--;

                    if (clearOldEntries)
                    {
                        ClearArray(buffer + count, 1);
                    }
                    break;
                }
            }
        }